

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

void Js::JavascriptBigInt::SubAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  unsigned_long **ppuVar5;
  digit_t dVar6;
  digit_t *local_48;
  digit_t tempCarryDigit_1;
  digit_t tempCarryDigit;
  digit_t i;
  digit_t *pDigit2;
  digit_t *pDigit1;
  digit_t carryDigit;
  JavascriptBigInt *pbi2_local;
  JavascriptBigInt *pbi1_local;
  
  carryDigit = (digit_t)pbi2;
  pbi2_local = pbi1;
  iVar3 = CompareAbsolute(pbi1,pbi2);
  if (iVar3 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1e6,"(pbi1->CompareAbsolute(pbi2) == 1)",
                                "pbi1->CompareAbsolute(pbi2) == 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pDigit1 = (digit_t *)0x0;
  ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                      ((WriteBarrierPtr *)&pbi2_local->m_digits);
  pDigit2 = *ppuVar5;
  ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                      ((WriteBarrierPtr *)(carryDigit + 0x10));
  i = (digit_t)*ppuVar5;
  for (tempCarryDigit = 0; tempCarryDigit < *(ulong *)(carryDigit + 0x18);
      tempCarryDigit = tempCarryDigit + 1) {
    tempCarryDigit_1 = 0;
    dVar6 = SubDigit(pDigit2[tempCarryDigit],*(digit_t *)(i + tempCarryDigit * 8),&tempCarryDigit_1)
    ;
    pDigit2[tempCarryDigit] = dVar6;
    dVar6 = SubDigit(pDigit2[tempCarryDigit],(digit_t)pDigit1,&tempCarryDigit_1);
    pDigit2[tempCarryDigit] = dVar6;
    pDigit1 = (digit_t *)tempCarryDigit_1;
  }
  for (; tempCarryDigit < pbi2_local->m_length && pDigit1 != (digit_t *)0x0;
      tempCarryDigit = tempCarryDigit + 1) {
    local_48 = (digit_t *)0x0;
    dVar6 = SubDigit(pDigit2[tempCarryDigit],(digit_t)pDigit1,(digit_t *)&local_48);
    pDigit2[tempCarryDigit] = dVar6;
    pDigit1 = local_48;
  }
  while( true ) {
    bVar2 = false;
    if (pbi2_local->m_length != 0) {
      ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)&pbi2_local->m_digits);
      bVar2 = (*ppuVar5)[pbi2_local->m_length - 1] == 0;
    }
    if (!bVar2) break;
    pbi2_local->m_length = pbi2_local->m_length - 1;
  }
  if (pbi2_local->m_length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1ff,"(pbi1->m_length > 0)","pbi1->m_length > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void JavascriptBigInt::SubAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        Assert(pbi1->CompareAbsolute(pbi2) == 1);
        digit_t carryDigit = 0;
        digit_t *pDigit1 = pbi1->m_digits;
        digit_t *pDigit2 = pbi2->m_digits;
        digit_t i = 0;

        for (; i < pbi2->m_length; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], pDigit2[i], &tempCarryDigit);
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        for (; i < pbi1->m_length && carryDigit > 0; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }
        // adjust length
        while ((pbi1->m_length>0) && (pbi1->m_digits[pbi1->m_length-1] == 0))
        {
            pbi1->m_length--;
        }
        Assert(pbi1->m_length > 0);
    }